

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

shared_ptr<mocker::ast::ForStmt> __thiscall
mocker::Parser::forStmt(Parser *this,TokIter *iter,TokIter end)

{
  Token *this_00;
  bool bVar1;
  TokenID TVar2;
  pointer this_01;
  __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
  iter_00;
  ASTNode *this_02;
  mapped_type *pmVar3;
  TokIter in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  shared_ptr<mocker::ast::ForStmt> sVar5;
  Position beg;
  Position end_00;
  NodeID local_140;
  size_t local_138;
  shared_ptr<mocker::ast::Expression> *psStack_130;
  TokIter local_128;
  size_t sStack_120;
  undefined1 local_110 [8];
  shared_ptr<mocker::ast::Statement> stmt;
  undefined1 local_f0 [8];
  shared_ptr<mocker::ast::Expression> update;
  undefined1 local_d0 [8];
  shared_ptr<mocker::ast::Expression> condition;
  undefined1 local_a0 [8];
  shared_ptr<mocker::ast::Expression> init;
  undefined1 local_80 [8];
  anon_class_24_2_341b408a throwError;
  GetTokenID local_60;
  GetTokenID id;
  size_t local_50;
  Position begPos;
  TokIter *iter_local;
  Parser *this_local;
  TokIter end_local;
  
  this_01 = __gnu_cxx::
            __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
            ::operator->((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                          *)end._M_current);
  Token::position((pair<mocker::Position,_mocker::Position> *)&id,this_01);
  GetTokenID::GetTokenID(&local_60,in_RCX);
  local_80 = (undefined1  [8])id.end._M_current;
  throwError.begPos.col = (size_t)end._M_current;
  TVar2 = GetTokenID::operator()(&local_60,*end._M_current);
  if (TVar2 == For) {
    __gnu_cxx::
    __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
    ::operator++((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                  *)end._M_current);
    init.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         __gnu_cxx::
         __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
         ::operator++((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                       *)end._M_current,0);
    TVar2 = GetTokenID::operator()
                      (&local_60,
                       (TokIter)init.
                                super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi);
    if (TVar2 != LeftParen) {
      forStmt::anon_class_24_2_341b408a::operator()((anon_class_24_2_341b408a *)local_80);
    }
    expression((Parser *)local_a0,iter,end);
    iter_00 = __gnu_cxx::
              __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
              ::operator++(end._M_current,0);
    TVar2 = GetTokenID::operator()(&local_60,(TokIter)iter_00._M_current);
    if (TVar2 != Semicolon) {
      forStmt::anon_class_24_2_341b408a::operator()((anon_class_24_2_341b408a *)local_80);
    }
    expression((Parser *)local_d0,iter,end);
    update.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           __gnu_cxx::
           __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
           ::operator++((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                         *)end._M_current,0);
    TVar2 = GetTokenID::operator()
                      (&local_60,
                       (TokIter)update.
                                super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi);
    if (TVar2 != Semicolon) {
      forStmt::anon_class_24_2_341b408a::operator()((anon_class_24_2_341b408a *)local_80);
    }
    expression((Parser *)local_f0,iter,end);
    stmt.super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         __gnu_cxx::
         __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
         ::operator++((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                       *)end._M_current,0);
    TVar2 = GetTokenID::operator()
                      (&local_60,
                       (TokIter)stmt.
                                super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi);
    if (TVar2 != RightParen) {
      forStmt::anon_class_24_2_341b408a::operator()((anon_class_24_2_341b408a *)local_80);
    }
    statement((Parser *)local_110,iter,end);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_110);
    if (!bVar1) {
      forStmt::anon_class_24_2_341b408a::operator()((anon_class_24_2_341b408a *)local_80);
    }
    local_128 = id.end._M_current;
    sStack_120 = local_50;
    this_00 = iter[2]._M_current;
    this_02 = &std::
               __shared_ptr_access<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_110)->super_ASTNode;
    local_140 = ast::ASTNode::getID(this_02);
    pmVar3 = std::
             unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
             ::operator[]((unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
                           *)this_00,&local_140);
    local_138 = (pmVar3->second).line;
    psStack_130 = (shared_ptr<mocker::ast::Expression> *)(pmVar3->second).col;
    beg.col = (size_t)local_128._M_current;
    beg.line = (size_t)iter;
    end_00.col = local_138;
    end_00.line = sStack_120;
    makeNode<mocker::ast::ForStmt,std::shared_ptr<mocker::ast::Expression>&,std::shared_ptr<mocker::ast::Expression>&,std::shared_ptr<mocker::ast::Expression>&,std::shared_ptr<mocker::ast::Statement>&>
              (this,beg,end_00,psStack_130,(shared_ptr<mocker::ast::Expression> *)local_a0,
               (shared_ptr<mocker::ast::Expression> *)local_d0,
               (shared_ptr<mocker::ast::Statement> *)local_f0);
    std::shared_ptr<mocker::ast::Statement>::~shared_ptr
              ((shared_ptr<mocker::ast::Statement> *)local_110);
    std::shared_ptr<mocker::ast::Expression>::~shared_ptr
              ((shared_ptr<mocker::ast::Expression> *)local_f0);
    std::shared_ptr<mocker::ast::Expression>::~shared_ptr
              ((shared_ptr<mocker::ast::Expression> *)local_d0);
    std::shared_ptr<mocker::ast::Expression>::~shared_ptr
              ((shared_ptr<mocker::ast::Expression> *)local_a0);
    _Var4._M_pi = extraout_RDX_00;
  }
  else {
    std::shared_ptr<mocker::ast::ForStmt>::shared_ptr
              ((shared_ptr<mocker::ast::ForStmt> *)this,(nullptr_t)0x0);
    _Var4._M_pi = extraout_RDX;
  }
  sVar5.super___shared_ptr<mocker::ast::ForStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  sVar5.super___shared_ptr<mocker::ast::ForStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ast::ForStmt>)
         sVar5.super___shared_ptr<mocker::ast::ForStmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ast::ForStmt> Parser::forStmt(TokIter &iter, TokIter end) {
  auto begPos = iter->position().first;
  auto id = GetTokenID(end);
  auto throwError = [begPos, &iter] {
    throw SyntaxError(begPos, iter->position().second);
  };

  if (id(iter) != TokenID::For)
    return nullptr;
  ++iter;
  if (id(iter++) != TokenID::LeftParen)
    throwError();
  auto init = expression(iter, end);
  if (id(iter++) != TokenID::Semicolon)
    throwError();
  auto condition = expression(iter, end);
  if (id(iter++) != TokenID::Semicolon)
    throwError();
  auto update = expression(iter, end);
  if (id(iter++) != TokenID::RightParen)
    throwError();
  auto stmt = statement(iter, end);
  if (!stmt)
    throwError();
  return makeNode<ast::ForStmt>(begPos, pos[stmt->getID()].second, init,
                                condition, update, stmt);
}